

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_csv.cpp
# Opt level: O1

void __thiscall duckdb::ReadCSVData::ReadCSVData(ReadCSVData *this)

{
  (this->super_BaseCSVData).super_TableFunctionData.column_ids.
  super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BaseCSVData).super_TableFunctionData.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_BaseCSVData).super_TableFunctionData.column_ids.
           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_BaseCSVData).super_TableFunctionData.super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__BaseCSVData_02495470;
  CSVReaderOptions::CSVReaderOptions(&(this->super_BaseCSVData).options);
  (this->super_BaseCSVData).filename_col_idx = 0;
  (this->super_BaseCSVData).hive_partition_col_idx = 0;
  (this->super_BaseCSVData).super_TableFunctionData.super_FunctionData._vptr_FunctionData =
       (_func_int **)&PTR__ReadCSVData_02495080;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_start.super__Bit_iterator_base + 8) = 0;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  *(uint *)((long)&(this->manually_set).super_vector<bool,_std::allocator<bool>_>.
                   super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_finish.super__Bit_iterator_base + 8) = 0;
  (this->manually_set).super_vector<bool,_std::allocator<bool>_>.
  super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_end_of_storage =
       (_Bit_pointer)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->buffer_manager).internal.
  super___shared_ptr<duckdb::CSVBufferManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->column_info).super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_info).super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_info).super_vector<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>.
  super__Vector_base<duckdb::ColumnInfo,_std::allocator<duckdb::ColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->csv_schema).columns.
  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->csv_schema).columns.
  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->csv_schema).columns.
  super_vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>.
  super__Vector_base<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->csv_schema).name_idx_map._M_h._M_buckets =
       &(this->csv_schema).name_idx_map._M_h._M_single_bucket;
  (this->csv_schema).name_idx_map._M_h._M_bucket_count = 1;
  (this->csv_schema).name_idx_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->csv_schema).name_idx_map._M_h._M_element_count = 0;
  (this->csv_schema).name_idx_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->csv_schema).name_idx_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->csv_schema).name_idx_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->csv_schema).file_path._M_dataplus._M_p = (pointer)&(this->csv_schema).file_path.field_2;
  (this->csv_schema).file_path._M_string_length = 0;
  (this->csv_schema).file_path.field_2._M_local_buf[0] = '\0';
  (this->csv_schema).rows_read = 0;
  (this->csv_schema).empty = false;
  return;
}

Assistant:

ReadCSVData::ReadCSVData() {
}